

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers_test.cpp
# Opt level: O2

void __thiscall Array2D_Basics_Test::Array2D_Basics_Test(Array2D_Basics_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_0313b7b8;
  return;
}

Assistant:

TEST(Array2D, Basics) {
    const int nx = 5, ny = 9;
    Array2D<Float> a(nx, ny);

    EXPECT_EQ(nx, a.xSize());
    EXPECT_EQ(ny, a.ySize());
    EXPECT_EQ(nx * ny, a.size());

    for (int y = 0; y < ny; ++y)
        for (int x = 0; x < nx; ++x)
            a(x, y) = 1000 * x + y;

    for (int y = 0; y < ny; ++y)
        for (int x = 0; x < nx; ++x)
            EXPECT_EQ(1000 * x + y, a(x, y));
}